

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionFunctions.cpp
# Opt level: O2

bool getExpFuncParameter(vector<ExpressionValue,_std::allocator<ExpressionValue>_> *parameters,
                        size_t index,StringLiteral **dest,Identifier *funcName,bool optional)

{
  pointer pEVar1;
  ulong uVar2;
  undefined3 in_register_00000081;
  unsigned_long local_8;
  
  pEVar1 = (parameters->super__Vector_base<ExpressionValue,_std::allocator<ExpressionValue>_>).
           _M_impl.super__Vector_impl_data._M_start;
  uVar2 = ((long)(parameters->super__Vector_base<ExpressionValue,_std::allocator<ExpressionValue>_>)
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar1) / 0x30;
  if ((CONCAT31(in_register_00000081,optional) != 0) && (uVar2 <= index)) {
    return true;
  }
  if ((index < uVar2) && (pEVar1[index].type == String)) {
    *dest = &pEVar1[index].strValue;
    return true;
  }
  local_8 = index + 1;
  Logger::queueError<unsigned_long,Identifier>
            (Error,"Invalid parameter %d for %s: expecting string",&local_8,funcName);
  return false;
}

Assistant:

bool getExpFuncParameter(const std::vector<ExpressionValue>& parameters, size_t index, const StringLiteral*& dest,
	const Identifier &funcName, bool optional)
{
	if (optional && index >= parameters.size())
		return true;

	if (index >= parameters.size() || !parameters[index].isString())
	{
		Logger::queueError(Logger::Error, "Invalid parameter %d for %s: expecting string",index+1,funcName);
		return false;
	}

	dest = &parameters[index].strValue;
	return true;
}